

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int need_value(FuncState *fs,int list)

{
  Instruction *pIVar1;
  int local_1c;
  Instruction i;
  int list_local;
  FuncState *fs_local;
  
  local_1c = list;
  while( true ) {
    if (local_1c == -1) {
      return 0;
    }
    pIVar1 = getjumpcontrol(fs,local_1c);
    if ((*pIVar1 & 0x3f) != 0x1b) break;
    local_1c = getjump(fs,local_1c);
  }
  return 1;
}

Assistant:

static int need_value(FuncState*fs,int list){
for(;list!=(-1);list=getjump(fs,list)){
Instruction i=*getjumpcontrol(fs,list);
if(GET_OPCODE(i)!=OP_TESTSET)return 1;
}
return 0;
}